

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cpp
# Opt level: O1

void __thiscall Liby::Channel::~Channel(Channel *this)

{
  _Manager_type p_Var1;
  
  removeChannel(this);
  p_Var1 = (this->erroEventCallback_).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->erroEventCallback_,(_Any_data *)&this->erroEventCallback_,
              __destroy_functor);
  }
  p_Var1 = (this->writEventCallback_).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->writEventCallback_,(_Any_data *)&this->writEventCallback_,
              __destroy_functor);
  }
  p_Var1 = (this->readEventCallback_).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)this,(_Any_data *)this,__destroy_functor);
  }
  return;
}

Assistant:

Channel::~Channel() { removeChannel(); }